

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_set_preview(exr_context_t ctxt,int part_index,char *name,exr_attr_preview_t *val)

{
  uint32_t uVar1;
  exr_attr_preview_t *p;
  exr_result_t eVar2;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar3;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar2 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar2;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar3 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      list = (exr_attribute_list_t *)
             (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
      eVar2 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
      if (val == (exr_attr_preview_t *)0x0) {
        eVar2 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"No input value for setting \'%s\', type \'preview\'",name);
        return eVar2;
      }
      if (eVar2 == 0) {
        if (attr->type != EXR_ATTR_PREVIEW) {
          eVar2 = (**(code **)(ctxt + 0x48))
                            (ctxt,0x10,
                             "\'%s\' requested type \'preview\', but attribute is type \'%s\'",name,
                             attr->type_name);
          return eVar2;
        }
        p = (attr->field_6).preview;
        uVar1 = val->width;
        if (((p->width == uVar1) && (p->height == val->height)) && (p->alloc_size != 0)) {
          memcpy(p->rgba,val->rgba,(ulong)(uVar1 * val->height * 4));
          return 0;
        }
        if (*ctxt != (_priv_exr_context_t)0x1) {
          eVar2 = (**(code **)(ctxt + 0x48))
                            (ctxt,0x14,
                             "Existing preview \'%s\' is %u x %u, requested is %u x %u, unable to change"
                             ,name,p->width,p->height,uVar1,val->height);
          return eVar2;
        }
        exr_attr_preview_destroy(ctxt,p);
      }
      else {
        if (eVar2 != 0xf) {
          return eVar2;
        }
        if (*ctxt != (_priv_exr_context_t)0x1) {
          return 0xf;
        }
        eVar2 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_PREVIEW,0,(uint8_t **)0x0,&attr);
        if (eVar2 != 0) {
          return eVar2;
        }
      }
      eVar2 = exr_attr_preview_create(ctxt,(attr->field_6).preview,val->width,val->height,val->rgba)
      ;
      return eVar2;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar3 = 8;
  }
  eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar3);
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_preview (
    exr_context_t             ctxt,
    int                       part_index,
    const char*               name,
    const exr_attr_preview_t* val)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (!val)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input value for setting '%s', type 'preview'",
            name));

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_PREVIEW,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_preview_create (
                ctxt, attr->preview, val->width, val->height, val->rgba);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_PREVIEW)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'preview', but attribute is type '%s'",
                name,
                attr->type_name));

        if (attr->preview->width == val->width &&
            attr->preview->height == val->height &&
            attr->preview->alloc_size > 0)
        {
            size_t copybytes = val->width * val->height * 4;
            memcpy (
                EXR_CONST_CAST (void*, attr->preview->rgba),
                val->rgba,
                copybytes);
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing preview '%s' is %u x %u, requested is %u x %u, unable to change",
                name,
                attr->preview->width,
                attr->preview->height,
                val->width,
                val->height));
        }
        else
        {
            exr_attr_preview_destroy (ctxt, attr->preview);
            rv = exr_attr_preview_create (
                ctxt, attr->preview, val->width, val->height, val->rgba);
        }
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}